

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
InvariantBlockBackwardIterator::UpdatePredBlockBV(InvariantBlockBackwardIterator *this)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  Type_conflict pBVar4;
  undefined4 *puVar5;
  Type *ppFVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Iterator local_40;
  
  bVar3 = true;
  if (this->followFlow == true) {
    this_00 = &this->blockBV;
    pBVar4 = (Type_conflict)this_00;
    do {
      pBVar4 = pBVar4->next;
      if (pBVar4 == (Type_conflict)0x0) goto LAB_00468fbe;
    } while ((pBVar4->data).word == 0);
    BVar2 = BVSparse<Memory::JitArenaAllocator>::Test(this_00,this->block->number);
    if (BVar2 == '\0') {
      bVar3 = false;
    }
    else {
LAB_00468fbe:
      pSVar7 = &(this->block->predList).
                super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      local_40.list = pSVar7;
      local_40.current = &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      while( true ) {
        if (pSVar7 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
        }
        local_40.current =
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
              &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
            local_40.list) break;
        ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            (&local_40);
        BVSparse<Memory::JitArenaAllocator>::Set(this_00,(*ppFVar6)->predBlock->number);
        pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool
InvariantBlockBackwardIterator::UpdatePredBlockBV()
{
    if (!this->followFlow)
    {
        return true;
    }

    // Track blocks we've visited to ensure that we only iterate over predecessor blocks
    if (!this->blockBV.IsEmpty() && !this->blockBV.Test(this->block->GetBlockNum()))
    {
        return false;
    }

    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, this->block->GetPredList())
    {
        this->blockBV.Set(edge->GetPred()->GetBlockNum());
    } NEXT_SLISTBASECOUNTED_ENTRY;

    return true;
}